

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.h
# Opt level: O2

Extent<double> * __thiscall
Parfait::Octree<Parfait::Facet>::Node::getChild3Extent
          (Extent<double> *__return_storage_ptr__,Node *this,Extent<double> *extent)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (extent->lo).pos._M_elems[1];
  dVar2 = (extent->lo).pos._M_elems[2];
  dVar3 = (extent->hi).pos._M_elems[0];
  dVar4 = (extent->hi).pos._M_elems[1];
  dVar5 = (extent->hi).pos._M_elems[2];
  (__return_storage_ptr__->lo).pos._M_elems[0] = (extent->lo).pos._M_elems[0];
  (__return_storage_ptr__->lo).pos._M_elems[1] = dVar1;
  (__return_storage_ptr__->hi).pos._M_elems[1] = dVar4;
  (__return_storage_ptr__->hi).pos._M_elems[2] = dVar5;
  (__return_storage_ptr__->lo).pos._M_elems[2] = dVar2;
  (__return_storage_ptr__->hi).pos._M_elems[0] = dVar3;
  dVar1 = (__return_storage_ptr__->lo).pos._M_elems[0];
  (__return_storage_ptr__->lo).pos._M_elems[1] =
       ((__return_storage_ptr__->lo).pos._M_elems[1] + (__return_storage_ptr__->hi).pos._M_elems[1])
       * 0.5;
  (__return_storage_ptr__->hi).pos._M_elems[0] =
       (dVar1 + (__return_storage_ptr__->hi).pos._M_elems[0]) * 0.5;
  (__return_storage_ptr__->hi).pos._M_elems[2] =
       ((__return_storage_ptr__->lo).pos._M_elems[2] + (__return_storage_ptr__->hi).pos._M_elems[2])
       * 0.5;
  return __return_storage_ptr__;
}

Assistant:

inline Parfait::Extent<double> getChild3Extent(const Parfait::Extent<double> &extent){
              Parfait::Extent<double> childExtent = extent;
              childExtent.lo[1] = 0.5*(childExtent.lo[1] + childExtent.hi[1]);
              childExtent.hi[0] = 0.5*(childExtent.lo[0] + childExtent.hi[0]);
              childExtent.hi[2] = 0.5*(childExtent.lo[2] + childExtent.hi[2]);
              return childExtent;
          }